

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void randomBlob(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  i64 iVar1;
  char *z;
  i64 nByte;
  
  iVar1 = sqlite3VdbeIntValue(*argv);
  nByte = 1;
  if (1 < iVar1) {
    nByte = iVar1;
  }
  z = (char *)contextMalloc(context,nByte);
  if (z != (char *)0x0) {
    sqlite3_randomness((int)nByte,z);
    setResultStrOrError(context,z,(int)nByte,'\0',sqlite3_free);
    return;
  }
  return;
}

Assistant:

static void randomBlob(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  sqlite3_int64 n;
  unsigned char *p;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<1 ){
    n = 1;
  }
  p = contextMalloc(context, n);
  if( p ){
    sqlite3_randomness(n, p);
    sqlite3_result_blob(context, (char*)p, n, sqlite3_free);
  }
}